

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O3

void __thiscall
wallet::wallet_tests::wallet_disableprivkeys::test_method(wallet_disableprivkeys *this)

{
  string label;
  string label_00;
  MockableData records;
  MockableData records_00;
  CWallet *pCVar1;
  bool bVar2;
  char *pcVar3;
  iterator pvVar4;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *puVar5;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  shared_ptr<wallet::CWallet> wallet;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock63;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 uVar8;
  check_type cVar9;
  undefined8 in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  size_t in_stack_fffffffffffffdf0;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  assertion_result local_1e0;
  undefined1 *local_1c8;
  assertion_result local_1c0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  CWallet *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  undefined1 local_148 [16];
  long *local_138 [2];
  long local_128 [2];
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_118;
  long *local_e0 [2];
  long local_d0 [2];
  undefined1 local_c0 [80];
  __index_type local_70;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0._0_8_ =
       (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
       super_BasicTestingSetup.m_node.chain._M_t.
       super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
       super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
       super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl._4_4_ = in_stack_fffffffffffffdcc;
  records._M_t._M_impl._0_4_ = in_stack_fffffffffffffdc8;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (undefined8)_cVar9;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffdd8;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffde0;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffde8;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffdf0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase((wallet *)&local_1e0,records);
  local_158 = (CWallet *)0x0;
  pcVar3 = "";
  puVar5 = (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
           &local_1e0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wallet::CWallet,std::allocator<wallet::CWallet>,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            (&local_150,&local_158,(allocator<wallet::CWallet> *)&local_1c0,(Chain **)local_c0,
             (char (*) [1])0xf73bdc,puVar5);
  if ((_Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>)
      local_1e0._0_8_ != (WalletDatabase *)0x0) {
    (**(code **)(*(long *)local_1e0._0_8_ + 8))();
  }
  local_1e0._0_8_ =
       (__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_68);
  CWallet::SetupLegacyScriptPubKeyMan(local_158);
  CWallet::SetMinVersion(local_158,FEATURE_LATEST,(WalletBatch *)0x0);
  CWallet::SetWalletFlag(local_158,0x100000000);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2d7;
  file.m_begin = (iterator)&local_168;
  msg.m_end = (iterator)puVar5;
  msg.m_begin = pcVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_178,msg);
  bVar2 = CWallet::TopUpKeyPool(local_158,1000);
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ = "!wallet->TopUpKeyPool(1000)";
  local_1c0.m_message.px = (element_type *)0xf8e2bc;
  local_c0[8] = false;
  local_c0._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_180 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar4 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_c0._24_8_ = (allocator<wallet::CWallet> *)&local_1c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,(lazy_ostream *)local_c0,1,0,WARN,_cVar9,(size_t)&local_188,0x2d7);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2d8;
  file_00.m_begin = (iterator)&local_198;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a8,
             msg_00);
  pCVar1 = local_158;
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"");
  label._M_dataplus._M_p._4_4_ = uVar8;
  label._M_dataplus._M_p._0_4_ = uVar7;
  label._M_string_length = (size_type)_cVar9;
  label.field_2._M_allocated_capacity = in_stack_fffffffffffffdd8;
  label.field_2._8_8_ = in_stack_fffffffffffffde0;
  CWallet::GetNewDestination
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)local_c0,pCVar1,BECH32,label);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_70 != '\x01');
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8 = local_148;
  local_148._0_8_ = "!wallet->GetNewDestination(OutputType::BECH32, \"\")";
  local_148._8_8_ = "";
  local_1e0.m_message.px = (element_type *)((ulong)local_1e0.m_message.px & 0xffffffffffffff00);
  local_1e0._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_1e8 = "";
  uVar7 = 0;
  uVar8 = 0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_1e0,1,0,WARN,_cVar9,(size_t)&local_1f0,0x2d8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  std::__detail::__variant::
  _Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                       *)local_c0);
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  local_c0._0_8_ =
       (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
       super_BasicTestingSetup.m_node.chain._M_t.
       super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
       super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
       super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_118._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118._M_impl.super__Rb_tree_header._M_header;
  local_118._M_impl._0_8_ = 0;
  local_118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118._M_impl.super__Rb_tree_header._M_node_count = 0;
  records_00._M_t._M_impl._4_4_ = uVar8;
  records_00._M_t._M_impl._0_4_ = uVar7;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (undefined8)_cVar9;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffdd8;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffde0;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffde8;
  records_00._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffdf0;
  local_118._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase((wallet *)&local_1e0,records_00);
  local_158 = (CWallet *)0x0;
  pcVar3 = "";
  puVar5 = (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
           &local_1e0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wallet::CWallet,std::allocator<wallet::CWallet>,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            (&local_150,&local_158,(allocator<wallet::CWallet> *)&local_1c0,(Chain **)local_c0,
             (char (*) [1])0xf73bdc,puVar5);
  if ((_Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>)
      local_1e0._0_8_ != (WalletDatabase *)0x0) {
    (**(code **)(*(undefined **)local_1e0._0_8_ + 8))();
  }
  local_1e0._0_8_ =
       (__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_118);
  local_148._0_8_ = &local_158->cs_wallet;
  local_148._8_8_ = local_148._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_148);
  CWallet::SetWalletFlag(local_158,0x400000000);
  CWallet::SetMinVersion(local_158,FEATURE_LATEST,(WalletBatch *)0x0);
  CWallet::SetWalletFlag(local_158,0x100000000);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_1f8 = "";
  file_01.m_end = (iterator)0x2e0;
  file_01.m_begin = (iterator)&local_200;
  msg_01.m_end = (iterator)puVar5;
  msg_01.m_begin = pcVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
             (size_t)&stack0xfffffffffffffdf0,msg_01);
  pCVar1 = local_158;
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
  label_00._M_dataplus._M_p._4_4_ = uVar8;
  label_00._M_dataplus._M_p._0_4_ = uVar7;
  label_00._M_string_length = (size_type)_cVar9;
  label_00.field_2._M_allocated_capacity = in_stack_fffffffffffffdd8;
  label_00.field_2._8_8_ = in_stack_fffffffffffffde0;
  CWallet::GetNewDestination
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)local_c0,pCVar1,BECH32,label_00);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_70 != '\x01');
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8 = &stack0xfffffffffffffde0;
  local_1e0.m_message.px = (element_type *)((ulong)local_1e0.m_message.px & 0xffffffffffffff00);
  local_1e0._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_1e0,1,0,WARN,0xf8d5ec,
             (size_t)&stack0xfffffffffffffdd0,0x2e0);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  std::__detail::__variant::
  _Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                       *)local_c0);
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_148);
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(wallet_disableprivkeys, TestChain100Setup)
{
    {
        const std::shared_ptr<CWallet> wallet = std::make_shared<CWallet>(m_node.chain.get(), "", CreateMockableWalletDatabase());
        wallet->SetupLegacyScriptPubKeyMan();
        wallet->SetMinVersion(FEATURE_LATEST);
        wallet->SetWalletFlag(WALLET_FLAG_DISABLE_PRIVATE_KEYS);
        BOOST_CHECK(!wallet->TopUpKeyPool(1000));
        BOOST_CHECK(!wallet->GetNewDestination(OutputType::BECH32, ""));
    }
    {
        const std::shared_ptr<CWallet> wallet = std::make_shared<CWallet>(m_node.chain.get(), "", CreateMockableWalletDatabase());
        LOCK(wallet->cs_wallet);
        wallet->SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
        wallet->SetMinVersion(FEATURE_LATEST);
        wallet->SetWalletFlag(WALLET_FLAG_DISABLE_PRIVATE_KEYS);
        BOOST_CHECK(!wallet->GetNewDestination(OutputType::BECH32, ""));
    }
}